

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void dc_128_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  int r;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    memset(local_8,0x80,(long)in_EDX);
    local_8 = (void *)(in_RSI + (long)local_8);
  }
  return;
}

Assistant:

static inline void dc_128_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                    int bh, const uint8_t *above,
                                    const uint8_t *left) {
  int r;
  (void)above;
  (void)left;

  for (r = 0; r < bh; r++) {
    memset(dst, 128, bw);
    dst += stride;
  }
}